

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall
testing::internal::SingleFailureChecker::~SingleFailureChecker(SingleFailureChecker *this)

{
  Type TVar1;
  TestPartResultArray *this_00;
  pointer pcVar2;
  int iVar3;
  int iVar4;
  TestPartResult *pTVar5;
  AssertionResult *pAVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  char *pcVar8;
  int i;
  undefined1 local_78 [8];
  string expected;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38;
  Message msg;
  
  this_00 = this->results_;
  TVar1 = this->type_;
  pcVar8 = "1 non-fatal failure";
  if (TVar1 == kFatalFailure) {
    pcVar8 = "1 fatal failure";
  }
  local_78 = (undefined1  [8])&expected._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,pcVar8,pcVar8 + (ulong)(TVar1 != kFatalFailure) * 4 + 0xf);
  Message::Message((Message *)&local_38);
  iVar3 = TestPartResultArray::size(this_00);
  if (iVar3 == 1) {
    pTVar5 = TestPartResultArray::GetTestPartResult(this_00,0);
    if (pTVar5->type_ == TVar1) {
      pcVar8 = strstr((pTVar5->message_)._M_dataplus._M_p,(this->substr_)._M_dataplus._M_p);
      if (pcVar8 != (char *)0x0) {
        AssertionSuccess();
        goto LAB_0010ecb3;
      }
      AssertionFailure();
      pAVar6 = AssertionResult::operator<<
                         ((AssertionResult *)&gtest_ar.message_,(char (*) [11])0x138cbf);
      pAVar6 = AssertionResult::operator<<
                         (pAVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_78);
      pAVar6 = AssertionResult::operator<<(pAVar6,(char (*) [14])" containing \"");
      pAVar6 = AssertionResult::operator<<(pAVar6,&this->substr_);
      pAVar6 = AssertionResult::operator<<(pAVar6,(char (*) [3])0x139830);
      pAVar6 = AssertionResult::operator<<(pAVar6,(char (*) [11])"  Actual:\n");
      pAVar6 = AssertionResult::operator<<(pAVar6,pTVar5);
      AssertionResult::AssertionResult((AssertionResult *)((long)&expected.field_2 + 8),pAVar6);
    }
    else {
      AssertionFailure();
      pAVar6 = AssertionResult::operator<<
                         ((AssertionResult *)&gtest_ar.message_,(char (*) [11])0x138cbf);
      pAVar6 = AssertionResult::operator<<
                         (pAVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_78);
      pAVar6 = AssertionResult::operator<<(pAVar6,(char (*) [2])0x13942e);
      pAVar6 = AssertionResult::operator<<(pAVar6,(char (*) [11])"  Actual:\n");
      pAVar6 = AssertionResult::operator<<(pAVar6,pTVar5);
      AssertionResult::AssertionResult((AssertionResult *)((long)&expected.field_2 + 8),pAVar6);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_38._M_head_impl + 0x10),"Expected: ",10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_38._M_head_impl + 0x10),(char *)local_78,
               (long)expected._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_38._M_head_impl + 0x10),"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_38._M_head_impl + 0x10),"  Actual: ",10);
    iVar3 = TestPartResultArray::size(this_00);
    std::ostream::operator<<((ostream *)(local_38._M_head_impl + 0x10),iVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_38._M_head_impl + 0x10)," failures",9);
    iVar3 = 0;
    while( true ) {
      iVar4 = TestPartResultArray::size(this_00);
      if (iVar4 <= iVar3) break;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_38._M_head_impl + 0x10),"\n",1);
      pTVar5 = TestPartResultArray::GetTestPartResult(this_00,iVar3);
      testing::operator<<((ostream *)(local_38._M_head_impl + 0x10),pTVar5);
      iVar3 = iVar3 + 1;
    }
    AssertionFailure();
    pAVar6 = AssertionResult::operator<<((AssertionResult *)&gtest_ar.message_,(Message *)&local_38)
    ;
    AssertionResult::AssertionResult((AssertionResult *)((long)&expected.field_2 + 8),pAVar6);
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
LAB_0010ecb3:
  if (local_38._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_38._M_head_impl + 8))();
  }
  if (local_78 != (undefined1  [8])&expected._M_string_length) {
    operator_delete((void *)local_78,expected._M_string_length + 1);
  }
  if (expected.field_2._M_local_buf[8] == '\0') {
    Message::Message((Message *)local_78);
    if (gtest_ar._0_8_ == 0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)gtest_ar._0_8_;
    }
    AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/vendor/googletest/googletest/src/gtest.cc"
               ,0x416,pcVar8);
    AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,(Message *)local_78);
    AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if (local_78 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_78 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  pcVar2 = (this->substr_)._M_dataplus._M_p;
  paVar7 = &(this->substr_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar7) {
    operator_delete(pcVar2,paVar7->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

SingleFailureChecker::~SingleFailureChecker() {
  EXPECT_PRED_FORMAT3(HasOneFailure, *results_, type_, substr_);
}